

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

void ExpFmt(GmfMshSct *msh,int KwdCod)

{
  int *piVar1;
  char cVar2;
  char *__s;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  __s = GmfKwdFmt[KwdCod][2];
  if (*GmfKwdFmt[KwdCod][1] == '\0') {
    iVar3 = 1;
  }
  else {
    iVar3 = 2;
    if ((((*__s == 'h') || (*__s == 's')) && (__s[1] == 'r')) && (__s[2] == '\0')) {
      msh->KwdTab[KwdCod].typ = 3;
      uVar4 = msh->KwdTab[KwdCod].NmbTyp;
      uVar9 = 0;
      uVar7 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar7 = uVar9;
      }
      uVar4 = 0;
      for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        switch(msh->KwdTab[KwdCod].TypTab[uVar9]) {
        case 1:
          uVar4 = uVar4 + 1;
          break;
        case 2:
          uVar4 = uVar4 + msh->dim;
          break;
        case 3:
          iVar3 = ((msh->dim + 1) * msh->dim) / 2;
          goto LAB_0010794a;
        case 4:
          iVar3 = msh->dim * msh->dim;
LAB_0010794a:
          uVar4 = uVar4 + iVar3;
        }
      }
      goto LAB_0010795e;
    }
  }
  msh->KwdTab[KwdCod].typ = iVar3;
  uVar4 = 0;
LAB_0010795e:
  msh->KwdTab[KwdCod].SolSiz = 0;
  msh->KwdTab[KwdCod].NmbWrd = 0;
  uVar9 = 0;
  uVar7 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar7 = uVar9;
  }
LAB_0010796c:
  do {
    sVar5 = strlen(__s);
    iVar3 = (int)uVar9;
    if ((int)sVar5 <= iVar3) break;
    cVar2 = __s[iVar3];
    uVar9 = (long)iVar3 + 1;
    if ((cVar2 == 's') || (cVar2 == 'h')) {
      cVar2 = __s[uVar9];
      uVar9 = uVar7;
      while (iVar6 = (int)uVar9, uVar9 = (ulong)(iVar6 - 1), iVar6 != 0) {
        iVar6 = msh->KwdTab[KwdCod].SolSiz;
        msh->KwdTab[KwdCod].SolSiz = iVar6 + 1;
        msh->KwdTab[KwdCod].fmt[iVar6] = cVar2;
      }
    }
    else {
      if (cVar2 != 'd') {
        iVar3 = msh->KwdTab[KwdCod].SolSiz;
        msh->KwdTab[KwdCod].SolSiz = iVar3 + 1;
        msh->KwdTab[KwdCod].fmt[iVar3] = cVar2;
        uVar9 = uVar9 & 0xffffffff;
        goto LAB_0010796c;
      }
      cVar2 = __s[uVar9];
      for (iVar6 = 0; iVar6 < msh->dim; iVar6 = iVar6 + 1) {
        iVar10 = msh->KwdTab[KwdCod].SolSiz;
        msh->KwdTab[KwdCod].SolSiz = iVar10 + 1;
        msh->KwdTab[KwdCod].fmt[iVar10] = cVar2;
      }
    }
    uVar9 = (ulong)(iVar3 + 2);
  } while( true );
  iVar3 = msh->FltSiz;
  iVar6 = msh->ver;
  uVar4 = msh->KwdTab[KwdCod].SolSiz;
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
  }
  do {
    if (uVar7 == uVar9) {
      if (((*__s == 'h') && (__s[1] == 'r')) &&
         ((__s[2] == '\0' && (iVar3 = msh->KwdTab[KwdCod].NmbNod, 1 < iVar3)))) {
        for (iVar6 = 1; iVar6 <= iVar3; iVar6 = iVar6 + 1) {
          for (lVar8 = 0; lVar8 < (int)uVar4; lVar8 = lVar8 + 1) {
            msh->KwdTab[KwdCod].fmt[(int)(uVar4 * iVar6 + (int)lVar8)] =
                 msh->KwdTab[KwdCod].fmt[lVar8];
            uVar4 = msh->KwdTab[KwdCod].SolSiz;
          }
          iVar3 = msh->KwdTab[KwdCod].NmbNod;
        }
        uVar4 = uVar4 * iVar3;
        msh->KwdTab[KwdCod].SolSiz = uVar4;
        msh->KwdTab[KwdCod].NmbWrd = iVar3 * msh->KwdTab[KwdCod].NmbWrd;
        uVar7 = 0;
        if (0 < (int)uVar4) {
          uVar7 = (ulong)uVar4;
        }
      }
      for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
        cVar2 = msh->KwdTab[KwdCod].fmt[uVar9];
        if (cVar2 == 'r') {
          piVar1 = &msh->KwdTab[KwdCod].NmbDbl;
          *piVar1 = *piVar1 + 1;
        }
        else if (cVar2 == 'i') {
          piVar1 = &msh->KwdTab[KwdCod].NmbInt;
          *piVar1 = *piVar1 + 1;
        }
      }
      return;
    }
    cVar2 = msh->KwdTab[KwdCod].fmt[uVar9];
    iVar10 = (iVar3 != 0x20) + 1;
    if ((cVar2 == 'r') || (iVar10 = (3 < iVar6) + 1, cVar2 == 'i')) {
LAB_00107a4b:
      piVar1 = &msh->KwdTab[KwdCod].NmbWrd;
      *piVar1 = *piVar1 + iVar10;
    }
    else if (cVar2 == 'c') {
      iVar10 = 0x40;
      goto LAB_00107a4b;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void ExpFmt(GmfMshSct *msh, int KwdCod)
{
   int         i, j, TmpSiz=0, IntWrd, FltWrd;
   char        chr;
   const char  *InpFmt = GmfKwdFmt[ KwdCod ][2];
   KwdSct      *kwd = &msh->KwdTab[ KwdCod ];

   // Set the kwd's type
   if(!strlen(GmfKwdFmt[ KwdCod ][1]))
      kwd->typ = InfKwd;
   else if( !strcmp(InpFmt, "sr") || !strcmp(InpFmt, "hr") )
      kwd->typ = SolKwd;
   else
      kwd->typ = RegKwd;

   // Get the solution-field's size
   if(kwd->typ == SolKwd)
      for(i=0;i<kwd->NmbTyp;i++)
         switch(kwd->TypTab[i])
         {
            case GmfSca    : TmpSiz += 1; break;
            case GmfVec    : TmpSiz += msh->dim; break;
            case GmfSymMat : TmpSiz += (msh->dim * (msh->dim+1)) / 2; break;
            case GmfMat    : TmpSiz += msh->dim * msh->dim; break;
         }

   // Scan each character from the format string
   i = kwd->SolSiz = kwd->NmbWrd = 0;

   while(i < (int)strlen(InpFmt))
   {
      chr = InpFmt[ i++ ];

      if(chr == 'd')
      {
         chr = InpFmt[i++];

         for(j=0;j<msh->dim;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else if((chr == 's')||(chr == 'h'))
      {
         chr = InpFmt[i++];

         for(j=0;j<TmpSiz;j++)
            kwd->fmt[ kwd->SolSiz++ ] = chr;
      }
      else
         kwd->fmt[ kwd->SolSiz++ ] = chr;
   }

   if(msh->FltSiz == 32)
      FltWrd = 1;
   else
      FltWrd = 2;

   if(msh->ver <= 3)
      IntWrd = 1;
   else
      IntWrd = 2;

   for(i=0;i<kwd->SolSiz;i++)
      switch(kwd->fmt[i])
      {
         case 'i' : kwd->NmbWrd += IntWrd; break;
         case 'c' : kwd->NmbWrd += FilStrSiz; break;
         case 'r' : kwd->NmbWrd += FltWrd;break;
      }

   // HO solution: duplicate the format as many times as the number of nodes
   if( !strcmp(InpFmt, "hr") && (kwd->NmbNod > 1) )
   {
      for(i=1;i<=kwd->NmbNod;i++)
         for(j=0;j<kwd->SolSiz;j++)
            kwd->fmt[ i * kwd->SolSiz + j ] = kwd->fmt[j];

      kwd->SolSiz *= kwd->NmbNod;
      kwd->NmbWrd *= kwd->NmbNod;
   }

   // Count the final number of intergers and reals needed by the Fortran API
   for(i=0;i<kwd->SolSiz;i++)
      if(kwd->fmt[i] == 'i')
         kwd->NmbInt++;
      else if(kwd->fmt[i] == 'r')
         kwd->NmbDbl++;
}